

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.cpp
# Opt level: O2

string * fs_filesystem_type_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  string_view fname;
  allocator<char> local_91;
  statfs s;
  
  iVar1 = statfs(path._M_str,(statfs *)&s);
  if (iVar1 == 0) {
    if (s.f_type == 0x6969) {
      __s = "nfs";
    }
    else if (s.f_type == 0x9fa0) {
      __s = "procfs";
    }
    else if (s.f_type == 0xef53) {
      __s = "ext4";
    }
    else if (s.f_type == 0x1021994) {
      __s = "tmpfs";
    }
    else if (s.f_type == 0x1021997) {
      __s = "v9fs";
    }
    else if (s.f_type == 0x15013346) {
      __s = "udf";
    }
    else if (s.f_type == 0x2011bab0) {
      __s = "exfat";
    }
    else if (s.f_type == 0x58465342) {
      __s = "xfs";
    }
    else if (s.f_type == 0x62656572) {
      __s = "sysfs";
    }
    else if (s.f_type == 0x64626720) {
      __s = "debugfs";
    }
    else if (s.f_type == 0x65735546) {
      __s = "fuse";
    }
    else if (s.f_type == 0x73717368) {
      __s = "squashfs";
    }
    else if (s.f_type == 0x74726163) {
      __s = "tracefs";
    }
    else if (s.f_type == 0xf2f52010) {
      __s = "f2fs";
    }
    else {
      if (s.f_type != 0x9123683e) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR:fs_filesystem_type ");
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,path._M_str,path._M_len);
        poVar2 = std::operator<<(poVar2," unknown type ID: ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::operator<<(poVar2,"\n");
        goto LAB_0010dcc3;
      }
      __s = "btrfs";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_91);
  }
  else {
    fname._M_str = "fs_type_linux";
    fname._M_len = 0xd;
    fs_print_error(path,fname);
LAB_0010dcc3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_filesystem_type(std::string_view path)
{
  // return name of filesystem type if known

  std::error_code ec;

#if defined(_WIN32) || defined(__CYGWIN__)

  std::string r(path);

  // Cygwin: assume user input Cygwin path root directly.
  if(!fs_is_cygwin()){

    r = fs_root_name(r);
    if(r.empty())
      return {};

    // GetVolumeInformationA requires a trailing backslash
    r.push_back('\\');
  }

  if(fs_trace) std::cout << "TRACE:filesystem_type(" << path << ") root: " << r << "\n";

  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getvolumeinformationa
  if(std::string name(MAX_PATH+1, '\0');
      GetVolumeInformationA(r.data(), nullptr, 0, nullptr, nullptr, nullptr, name.data(), static_cast<DWORD>(name.size())))
    return fs_trim(name);
#elif defined(__linux__)
# ifdef HAVE_LINUX_MAGIC_H
  return fs_type_linux(path);
# else
  ec = std::make_error_code(std::errc::function_not_supported);
# endif
#elif defined(__APPLE__) || defined(BSD)
  struct statfs s;
  if(!statfs(path.data(), &s))
    return s.f_fstypename;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}